

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_2_5::Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(IStream *in,uint *v)

{
  undefined8 in_RAX;
  uchar b [4];
  
  b = SUB84((ulong)in_RAX >> 0x20,0);
  (*in->_vptr_IStream[3])(in,b,4);
  *v = (uint)b;
  return;
}

Assistant:

void
read (T &in, unsigned int &v)
{
    unsigned char b[4];

    readUnsignedChars<S> (in, b, 4);

    v =  (b[0]        & 0x000000ff) |
	((b[1] << 8)  & 0x0000ff00) |
	((b[2] << 16) & 0x00ff0000) |
	 (b[3] << 24);
}